

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

char * __thiscall gflags::anon_unknown_2::CommandLineFlag::CleanFileName(CommandLineFlag *this)

{
  char *pcVar1;
  CommandLineFlag *this_local;
  
  pcVar1 = filename(this);
  return pcVar1;
}

Assistant:

const char* CommandLineFlag::CleanFileName() const {
  // This function has been used to strip off a common prefix from
  // flag source file names. Because flags can be defined in different
  // shared libraries, there may not be a single common prefix.
  // Further, this functionality hasn't been active for many years.
  // Need a better way to produce more user friendly help output or
  // "anonymize" file paths in help output, respectively.
  // Follow issue at: https://github.com/gflags/gflags/issues/86
  return filename();
}